

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_misc.h
# Opt level: O1

void cpost(char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char msg [2050];
  undefined8 local_8e8;
  void **local_8e0;
  undefined1 *local_8d8;
  undefined1 local_8c8 [8];
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  char local_818 [2048];
  undefined1 local_18;
  
  local_8d8 = local_8c8;
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  local_8e0 = &ap[0].overflow_arg_area;
  local_8e8 = 0x3000000008;
  local_8c0 = in_RSI;
  local_8b8 = in_RDX;
  local_8b0 = in_RCX;
  local_8a8 = in_R8;
  local_8a0 = in_R9;
  vsnprintf(local_818,0x800,fmt,&local_8e8);
  local_18 = 0;
  sVar1 = strlen(local_818);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_818,sVar1);
  return;
}

Assistant:

MOCK_EXPORT void cpost(const char *fmt, ...)
        {
            char msg[2048+2];
            va_list ap;

            va_start(ap, fmt);
            vsnprintf(msg, 2048, fmt, ap);
            va_end(ap);
            msg[2048] = '\0';
            //printf(msg);
            std::cout << msg;
        }